

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError PaAlsaStreamComponent_EndProcessing
                  (PaAlsaStreamComponent *self,unsigned_long numFrames,int *xrun)

{
  snd_pcm_format_t sVar1;
  snd_pcm_t *psVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  undefined8 uStack_40;
  long lStack_38;
  
  if (self->ready == 0) {
    return 0;
  }
  iVar4 = 0;
  if ((self->canMmap == 0) && (self->streamDir == StreamDirection_Out)) {
    if (self->hostInterleaved == 0) {
      lVar3 = -((ulong)(uint)self->numHostChannels * 8 + 0xf & 0xfffffffffffffff0);
      sVar1 = self->nativeFormat;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x112ef2;
      iVar5 = snd_pcm_format_size(sVar1);
      iVar4 = self->numHostChannels;
      if (0 < (long)iVar4) {
        pvVar6 = self->nonMmapBuffer;
        lVar7 = 0;
        do {
          *(void **)((long)&lStack_38 + lVar3 + lVar7 * 8) = pvVar6;
          pvVar6 = (void *)((long)pvVar6 + (long)iVar5);
          lVar7 = lVar7 + 1;
        } while (iVar4 != lVar7);
      }
      psVar2 = self->pcm;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x112f21;
      iVar4 = snd_pcm_writen(psVar2,(long)&lStack_38 + lVar3,numFrames);
    }
    else {
      uStack_40 = 0x112ec1;
      iVar4 = snd_pcm_writei(self->pcm,self->nonMmapBuffer,numFrames);
    }
  }
  if (self->canMmap != 0) {
    uStack_40 = 0x112f3b;
    iVar4 = snd_pcm_mmap_commit(self->pcm,self->offset,numFrames);
  }
  if ((iVar4 == -0x20) || (iVar4 == -0x56)) {
    *xrun = 1;
  }
  else if (iVar4 < 0) {
    uStack_40 = 0x112f69;
    PaAlsaStreamComponent_EndProcessing_cold_1();
    return -9999;
  }
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_EndProcessing( PaAlsaStreamComponent *self, unsigned long numFrames, int *xrun )
{
    PaError result = paNoError;
    int res = 0;

    /* @concern FullDuplex It is possible that only one direction is marked ready after polling, and processed
     * afterwards
     */
    if( !self->ready )
        goto end;

    if( !self->canMmap && StreamDirection_Out == self->streamDir )
    {
        /* Play sound */
        if( self->hostInterleaved )
            res = alsa_snd_pcm_writei( self->pcm, self->nonMmapBuffer, numFrames );
        else
        {
            void *bufs[self->numHostChannels];
            int bufsize = alsa_snd_pcm_format_size( self->nativeFormat, self->framesPerPeriod + 1 );
            unsigned char *buffer = self->nonMmapBuffer;
            int i;
            for( i = 0; i < self->numHostChannels; ++i )
            {
                bufs[i] = buffer;
                buffer += bufsize;
            }
            res = alsa_snd_pcm_writen( self->pcm, bufs, numFrames );
        }
    }

    if( self->canMmap )
        res = alsa_snd_pcm_mmap_commit( self->pcm, self->offset, numFrames );

    if( res == -EPIPE || res == -ESTRPIPE )
    {
        *xrun = 1;
    }
    else
    {
        ENSURE_( res, paUnanticipatedHostError );
    }

end:
error:
    return result;
}